

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

string * __thiscall
testing::internal::FormatFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  undefined8 *puVar1;
  long lVar2;
  size_t sVar3;
  undefined8 *puVar4;
  long *plVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  ulong uVar7;
  undefined8 uVar8;
  string file_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  int local_ac;
  undefined8 *local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  string local_68;
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  local_ac = (int)file;
  if (this == (internal *)0x0) {
    this = (internal *)"unknown file";
  }
  local_88 = local_78;
  sVar3 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,this,this + sVar3);
  if (local_ac < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_88,local_88 + local_80);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    goto LAB_00126ff0;
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_88,local_88 + local_80);
  std::__cxx11::string::append((char *)&local_48);
  StreamableToString<int>(&local_68,&local_ac);
  uVar7 = 0xf;
  if (local_48 != local_38) {
    uVar7 = local_38[0];
  }
  if (uVar7 < local_68._M_string_length + local_40) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar8 = local_68.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_68._M_string_length + local_40) goto LAB_00126ede;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_48);
  }
  else {
LAB_00126ede:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68._M_dataplus._M_p);
  }
  local_a8 = &local_98;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_98 = *puVar1;
    uStack_90 = puVar4[3];
  }
  else {
    local_98 = *puVar1;
    local_a8 = (undefined8 *)*puVar4;
  }
  local_a0 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_a8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    lVar2 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
LAB_00126ff0:
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatFileLocation(const char* file, int line) {
  const std::string file_name(file == NULL ? kUnknownFile : file);

  if (line < 0) {
    return file_name + ":";
  }
#ifdef _MSC_VER
  return file_name + "(" + StreamableToString(line) + "):";
#else
  return file_name + ":" + StreamableToString(line) + ":";
#endif  // _MSC_VER
}